

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void SortByDistance(int *aIdx,int nIdx,RtreeDValue *aDistance,int *aSpare)

{
  int *aIdx_00;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  long lVar6;
  int nIdx_00;
  uint nIdx_01;
  int iVar7;
  
  if (nIdx < 2) {
    return;
  }
  nIdx_01 = (uint)nIdx >> 1;
  nIdx_00 = nIdx - nIdx_01;
  aIdx_00 = aIdx + nIdx_01;
  SortByDistance(aIdx,nIdx_01,aDistance,aSpare);
  SortByDistance(aIdx_00,nIdx_00,aDistance,aSpare);
  memcpy(aSpare,aIdx,(ulong)nIdx_01 * 4);
  uVar5 = 0;
  iVar3 = 0;
LAB_001c7d6e:
  do {
    iVar4 = (int)uVar5;
    lVar6 = 0;
    while( true ) {
      iVar2 = (int)lVar6;
      if (((int)nIdx_01 <= iVar4 + iVar2) && (nIdx_00 <= iVar3)) {
        return;
      }
      if (nIdx_01 - iVar4 == iVar2) {
        aIdx[(int)(nIdx_01 + iVar3)] = aIdx_00[iVar3];
        iVar3 = iVar3 + 1;
        uVar5 = (ulong)nIdx_01;
        goto LAB_001c7d6e;
      }
      iVar1 = aSpare[uVar5 + lVar6];
      if (iVar3 == nIdx_00) {
        aIdx[iVar4 + iVar2 + nIdx_00] = iVar1;
        uVar5 = (ulong)(iVar2 + iVar4 + 1);
        iVar3 = nIdx_00;
        goto LAB_001c7d6e;
      }
      iVar7 = iVar4 + iVar3 + iVar2;
      if (aDistance[aIdx_00[iVar3]] < aDistance[iVar1] ||
          aDistance[aIdx_00[iVar3]] == aDistance[iVar1]) break;
      aIdx[iVar7] = iVar1;
      lVar6 = lVar6 + 1;
    }
    aIdx[iVar7] = aIdx_00[iVar3];
    uVar5 = (ulong)(uint)(iVar4 + iVar2);
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

static void SortByDistance(
  int *aIdx, 
  int nIdx, 
  RtreeDValue *aDistance, 
  int *aSpare
){
  if( nIdx>1 ){
    int iLeft = 0;
    int iRight = 0;

    int nLeft = nIdx/2;
    int nRight = nIdx-nLeft;
    int *aLeft = aIdx;
    int *aRight = &aIdx[nLeft];

    SortByDistance(aLeft, nLeft, aDistance, aSpare);
    SortByDistance(aRight, nRight, aDistance, aSpare);

    memcpy(aSpare, aLeft, sizeof(int)*nLeft);
    aLeft = aSpare;

    while( iLeft<nLeft || iRight<nRight ){
      if( iLeft==nLeft ){
        aIdx[iLeft+iRight] = aRight[iRight];
        iRight++;
      }else if( iRight==nRight ){
        aIdx[iLeft+iRight] = aLeft[iLeft];
        iLeft++;
      }else{
        RtreeDValue fLeft = aDistance[aLeft[iLeft]];
        RtreeDValue fRight = aDistance[aRight[iRight]];
        if( fLeft<fRight ){
          aIdx[iLeft+iRight] = aLeft[iLeft];
          iLeft++;
        }else{
          aIdx[iLeft+iRight] = aRight[iRight];
          iRight++;
        }
      }
    }

#if 0
    /* Check that the sort worked */
    {
      int jj;
      for(jj=1; jj<nIdx; jj++){
        RtreeDValue left = aDistance[aIdx[jj-1]];
        RtreeDValue right = aDistance[aIdx[jj]];
        assert( left<=right );
      }
    }
#endif
  }
}